

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O2

void __thiscall
cfg::tag_int_scalar_t<cfgfile::string_trait_t>::tag_int_scalar_t
          (tag_int_scalar_t<cfgfile::string_trait_t> *this,tag_t<cfgfile::string_trait_t> *owner,
          string_t *name,bool is_mandatory)

{
  set<int,_std::less<int>,_std::allocator<int>_> *this_00;
  _Rb_tree_header *p_Var1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  allocator local_59;
  string_t local_58;
  string local_38 [32];
  
  cfgfile::tag_scalar_t<int,_cfgfile::string_trait_t>::tag_scalar_t
            (&this->super_tag_scalar_t<int,_cfgfile::string_trait_t>,owner,name,is_mandatory);
  (this->super_tag_scalar_t<int,_cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>.
  _vptr_tag_t = (_func_int **)&PTR__tag_int_scalar_t_00138b60;
  (this->m_int_scalar_constraint).super_constraint_t<int>._vptr_constraint_t =
       (_func_int **)&PTR__constraint_one_of_t_00138bc0;
  p_Var1 = &(this->m_int_scalar_constraint).m_list._M_t._M_impl.super__Rb_tree_header;
  (this->m_int_scalar_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->m_int_scalar_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_int_scalar_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_int_scalar_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_int_scalar_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string(local_38,"string_field",&local_59);
  std::__cxx11::string::string((string *)&local_58,local_38);
  cfgfile::
  tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  ::tag_scalar_t(&this->m_string_field,(tag_t<cfgfile::string_trait_t> *)this,&local_58,true);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string(local_38);
  (this->m_string_field_constraint).
  super_constraint_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_constraint_t = (_func_int **)&PTR__constraint_one_of_t_001388e0;
  p_Var1 = &(this->m_string_field_constraint).m_list._M_t._M_impl.super__Rb_tree_header;
  (this->m_string_field_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->m_string_field_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_string_field_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_string_field_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_string_field_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58._M_dataplus._M_p._0_4_ = 100;
  this_00 = &(this->m_int_scalar_constraint).m_list;
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)this_00,
             (int *)&local_58);
  local_58._M_dataplus._M_p._0_4_ = 200;
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)this_00,
             (int *)&local_58);
  local_58._M_dataplus._M_p._0_4_ = 300;
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)this_00,
             (int *)&local_58);
  (this->super_tag_scalar_t<int,_cfgfile::string_trait_t>).m_constraint =
       &(this->m_int_scalar_constraint).super_constraint_t<int>;
  std::__cxx11::string::string((string *)&local_58,"one",(allocator *)local_38);
  this_01 = &(this->m_string_field_constraint).m_list;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_58,"two",(allocator *)local_38);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_58,"three",(allocator *)local_38);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  (this->m_string_field).m_constraint =
       &(this->m_string_field_constraint).
        super_constraint_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ;
  return;
}

Assistant:

tag_int_scalar_t( cfgfile::tag_t< Trait > & owner, const typename Trait::string_t & name, bool is_mandatory )
		:	cfgfile::tag_scalar_t< int, Trait >( owner, name, is_mandatory )
		,	m_string_field( *this, Trait::from_ascii( "string_field" ), true )
		,	m_string_field_constraint()
	{
		m_int_scalar_constraint.add_value( 100 );
		m_int_scalar_constraint.add_value( 200 );
		m_int_scalar_constraint.add_value( 300 );
		this->set_constraint( &m_int_scalar_constraint );

		m_string_field_constraint.add_value( "one" );
		m_string_field_constraint.add_value( "two" );
		m_string_field_constraint.add_value( "three" );
		m_string_field.set_constraint( &m_string_field_constraint );

	}